

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorsTests.cpp
# Opt level: O0

void __thiscall
VectorsTest_FP3QuotientAssignment_Test::TestBody(VectorsTest_FP3QuotientAssignment_Test *this)

{
  bool bVar1;
  AssertHelper *this_00;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  FP3 v2;
  FP3 v1;
  AssertHelper *in_stack_fffffffffffffe90;
  double *in_stack_fffffffffffffe98;
  double *expected;
  char *in_stack_fffffffffffffea0;
  AssertionResult *this_01;
  undefined4 in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  int line;
  char *in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffeb8;
  Type TVar2;
  AssertHelper *in_stack_fffffffffffffec0;
  AssertionResult *this_02;
  Vector3<double> *this_03;
  Vector3<double> *this_04;
  Vector3<double> local_e8;
  AssertionResult local_d0 [2];
  Vector3<double> local_b0;
  AssertionResult local_98;
  uint local_84;
  Vector3<double> local_60;
  AssertionResult local_48;
  Vector3<double> local_38;
  Vector3<double> local_20;
  
  TVar2 = (Type)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  this_03 = &local_20;
  pica::Vector3<double>::Vector3(this_03,12.0,24.0,21.0);
  pica::Vector3<double>::Vector3(&local_38,6.0,8.0,3.0);
  pica::operator/=(this_03,&local_38);
  this_04 = &local_60;
  pica::Vector3<double>::Vector3(this_04,2.0,3.0,7.0);
  testing::internal::EqHelper<false>::Compare<double,double>
            ((char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
             in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,(double *)in_stack_fffffffffffffe90
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_48);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffec0);
    testing::AssertionResult::failure_message((AssertionResult *)0x1e459e);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffec0,TVar2,in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,
               in_stack_fffffffffffffea0);
    testing::internal::AssertHelper::operator=((AssertHelper *)this_04,(Message *)this_03);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe90);
    testing::Message::~Message((Message *)0x1e45fb);
  }
  local_84 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e4669);
  if (local_84 == 0) {
    TVar2 = (Type)((ulong)&local_20.y >> 0x20);
    pica::Vector3<double>::Vector3(&local_b0,2.0,3.0,7.0);
    this_02 = &local_98;
    testing::internal::EqHelper<false>::Compare<double,double>
              ((char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
               in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
               (double *)in_stack_fffffffffffffe90);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(this_02);
    if (!bVar1) {
      testing::Message::Message((Message *)this_02);
      in_stack_fffffffffffffeb0 =
           testing::AssertionResult::failure_message((AssertionResult *)0x1e4740);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this_02,TVar2,in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,
                 in_stack_fffffffffffffea0);
      testing::internal::AssertHelper::operator=((AssertHelper *)this_04,(Message *)this_03);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe90);
      testing::Message::~Message((Message *)0x1e479d);
    }
    local_84 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e480b);
    if (local_84 == 0) {
      expected = &local_20.z;
      pica::Vector3<double>::Vector3(&local_e8,2.0,3.0,7.0);
      this_01 = local_d0;
      testing::internal::EqHelper<false>::Compare<double,double>
                ((char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                 &this_01->success_,expected,(double *)in_stack_fffffffffffffe90);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
      line = CONCAT13(bVar1,(int3)in_stack_fffffffffffffeac);
      if (!bVar1) {
        testing::Message::Message((Message *)this_02);
        this_00 = (AssertHelper *)
                  testing::AssertionResult::failure_message((AssertionResult *)0x1e48e2);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)this_02,TVar2,in_stack_fffffffffffffeb0,line,&this_01->success_);
        testing::internal::AssertHelper::operator=((AssertHelper *)this_04,(Message *)this_03);
        testing::internal::AssertHelper::~AssertHelper(this_00);
        testing::Message::~Message((Message *)0x1e493f);
      }
      local_84 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e49aa);
    }
  }
  return;
}

Assistant:

TEST(VectorsTest, FP3QuotientAssignment)
{
    FP3 v1(12, 24, 21), v2(6, 8, 3);
    v1 /= v2;
    ASSERT_EQ_FP3(v1, FP3(2, 3, 7));
}